

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<int>::TPZVec(TPZVec<int> *this,initializer_list<int> *list)

{
  ulong uVar1;
  iterator piVar2;
  int *piVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  this->fStore = (int *)0x0;
  uVar1 = list->_M_len;
  if (uVar1 != 0) {
    piVar3 = (int *)operator_new__(-(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4);
    this->fStore = piVar3;
    piVar2 = list->_M_array;
    piVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined4 *)((long)piVar3 + lVar4) = *(undefined4 *)((long)piVar2 + lVar4);
      lVar4 = lVar4 + 4;
    } while (uVar1 * 4 - lVar4 != 0);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}